

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateDebugInfoOperand
          (ValidationState_t *_,string *debug_inst_name,
          CommonDebugInfoInstructions expected_debug_inst,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  AssemblyGrammar *this;
  spv_ext_inst_type_t *psVar3;
  DiagnosticStream *pDVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  DiagnosticStream local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  DiagnosticStream local_248;
  spv_ext_inst_desc local_70;
  spv_ext_inst_desc desc;
  undefined1 local_60 [8];
  function<bool_(CommonDebugInfoInstructions)> expectation;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  uint32_t word_index_local;
  Instruction *inst_local;
  CommonDebugInfoInstructions expected_debug_inst_local;
  string *debug_inst_name_local;
  ValidationState_t *__local;
  
  desc._4_4_ = expected_debug_inst;
  expectation._M_invoker = (_Invoker_type)ext_inst_name;
  std::function<bool(CommonDebugInfoInstructions)>::
  function<spvtools::val::(anonymous_namespace)::ValidateDebugInfoOperand(spvtools::val::ValidationState_t&,std::__cxx11::string_const&,CommonDebugInfoInstructions,spvtools::val::Instruction_const*,unsigned_int,std::function<std::__cxx11::string()>const&)::__0,void>
            ((function<bool(CommonDebugInfoInstructions)> *)local_60,
             (anon_class_4_1_4c78c9f9 *)((long)&desc + 4));
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)local_60,inst,word_index);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    local_70 = (spv_ext_inst_desc)0x0;
    this = ValidationState_t::grammar(_);
    psVar3 = val::Instruction::ext_inst_type(inst);
    sVar2 = AssemblyGrammar::lookupExtInst(this,*psVar3,expected_debug_inst,&local_70);
    if ((sVar2 == SPV_SUCCESS) && (local_70 != (spv_ext_inst_desc)0x0)) {
      ValidationState_t::diag(&local_440,_,SPV_ERROR_INVALID_DATA,inst);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_460,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                  *)expectation._M_invoker);
      pDVar4 = DiagnosticStream::operator<<(&local_440,&local_460);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [3])0xec9916);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [18])0xf37ded);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,debug_inst_name);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [25])0xf375e6);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_70->name);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      std::__cxx11::string::~string((string *)&local_460);
      DiagnosticStream::~DiagnosticStream(&local_440);
    }
    else {
      ValidationState_t::diag(&local_248,_,SPV_ERROR_INVALID_DATA,inst);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_268,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                  *)expectation._M_invoker);
      pDVar4 = DiagnosticStream::operator<<(&local_248,&local_268);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [3])0xec9916);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [18])0xf37ded);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,debug_inst_name);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [12])0xe35fa0);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      std::__cxx11::string::~string((string *)&local_268);
      DiagnosticStream::~DiagnosticStream(&local_248);
    }
  }
  desc._0_4_ = 1;
  std::function<bool_(CommonDebugInfoInstructions)>::~function
            ((function<bool_(CommonDebugInfoInstructions)> *)local_60);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateDebugInfoOperand(
    ValidationState_t& _, const std::string& debug_inst_name,
    CommonDebugInfoInstructions expected_debug_inst, const Instruction* inst,
    uint32_t word_index, const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [expected_debug_inst](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == expected_debug_inst;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(inst->ext_inst_type(), expected_debug_inst,
                                &desc) != SPV_SUCCESS ||
      !desc) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << debug_inst_name << " is invalid";
  }
  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name << " must be a result id of "
         << desc->name;
}